

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastReduceMatrix(Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Wec_t *vLevels,Vec_Int_t *vRes)

{
  uint uVar1;
  int b;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int NodeC;
  int NodeS;
  int local_68;
  int local_64;
  ulong local_60;
  Gia_Man_t *local_58;
  Vec_Wec_t *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  uVar1 = vProds->nSize;
  local_60 = (ulong)uVar1;
  local_58 = pNew;
  if (uVar1 != vLevels->nSize) {
    __assert_fail("nSize == Vec_WecSize(vLevels)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x27d,
                  "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
  if (0 < (int)uVar1) {
    uVar8 = 0;
    local_50 = vProds;
    do {
      if ((long)vProds->nSize <= (long)uVar8) goto LAB_00305c5d;
      uVar11 = uVar8 + 1;
      local_48 = uVar8 << 4;
      local_40 = uVar8;
      local_38 = uVar11;
      while( true ) {
        iVar9 = *(int *)((long)&vProds->pArray->nSize + local_48);
        if (iVar9 < 3) break;
        pVVar6 = (Vec_Int_t *)((long)&vProds->pArray->nCap + local_48);
        piVar4 = pVVar6->pArray;
        pVVar6->nSize = iVar9 - 1U;
        iVar5 = piVar4[iVar9 - 1U];
        pVVar6->nSize = iVar9 - 2U;
        b = piVar4[iVar9 - 2U];
        pVVar6->nSize = iVar9 - 3U;
        if ((long)vLevels->nSize <= (long)local_40) goto LAB_00305c5d;
        iVar2 = *(int *)((long)&vLevels->pArray->nSize + local_48);
        if (iVar2 < 1) {
LAB_00305c7c:
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
        }
        iVar9 = piVar4[iVar9 - 3U];
        pVVar7 = (Vec_Int_t *)((long)&vLevels->pArray->nCap + local_48);
        piVar4 = pVVar7->pArray;
        pVVar7->nSize = iVar2 - 1U;
        if (iVar2 == 1) goto LAB_00305c7c;
        iVar3 = piVar4[iVar2 - 1U];
        pVVar7->nSize = iVar2 - 2U;
        if (iVar2 < 3) goto LAB_00305c7c;
        iVar10 = piVar4[iVar2 - 2U];
        pVVar7->nSize = iVar2 - 3U;
        iVar2 = piVar4[iVar2 - 3U];
        Wlc_BlastFullAdder(local_58,iVar5,b,iVar9,&local_68,&local_64);
        if (iVar10 < iVar3) {
          iVar10 = iVar3;
        }
        if (iVar10 <= iVar2) {
          iVar10 = iVar2;
        }
        Wlc_IntInsert(pVVar6,pVVar7,local_64,iVar10 + 2);
        uVar11 = local_38;
        vProds = local_50;
        if ((((long)local_50->nSize <= (long)local_38) || ((long)vLevels->nSize <= (long)local_38))
           || (Wlc_IntInsert(local_50->pArray + local_38,vLevels->pArray + local_38,local_68,
                             iVar10 + 1), (long)vProds->nSize <= (long)local_40)) goto LAB_00305c5d;
      }
      uVar8 = uVar11;
    } while (uVar11 != local_60);
  }
  uVar8 = local_60;
  iVar9 = (int)local_60;
  if (0 < iVar9) {
    uVar11 = 0;
    do {
      if ((long)vProds->nSize <= (long)uVar11) goto LAB_00305c5d;
      iVar5 = vProds->pArray[uVar11].nSize;
      if (iVar5 < 2) {
        pVVar6 = vProds->pArray + uVar11;
        do {
          Vec_IntPush(pVVar6,0);
          iVar5 = pVVar6->nSize;
        } while (iVar5 < 2);
      }
      if (iVar5 != 2) {
        __assert_fail("Vec_IntSize(vProd) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                      ,0x2a3,
                      "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)"
                     );
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar8);
  }
  if (vLevels->nSize < 1) {
LAB_00305c5d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar6 = vLevels->pArray;
  vRes->nSize = 0;
  pVVar6->nSize = 0;
  if (0 < iVar9) {
    lVar12 = 8;
    uVar11 = 0;
    do {
      if ((long)vProds->nSize <= (long)uVar11) goto LAB_00305c5d;
      pVVar7 = vProds->pArray;
      if ((*(int *)((long)pVVar7 + lVar12 + -4) < 1) ||
         (Vec_IntPush(vRes,**(int **)((long)&pVVar7->nCap + lVar12)),
         *(int *)((long)pVVar7 + lVar12 + -4) < 2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(pVVar6,*(int *)(*(long *)((long)&pVVar7->nCap + lVar12) + 4));
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x10;
      uVar8 = local_60;
    } while (local_60 != uVar11);
  }
  Wlc_BlastAdder(local_58,vRes->pArray,pVVar6->pArray,(int)uVar8);
  return;
}

Assistant:

void Wlc_BlastReduceMatrix( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Wec_t * vLevels, Vec_Int_t * vRes )
{
    Vec_Int_t * vLevel, * vProd;
    int i, NodeS, NodeC, LevelS, LevelC, Node1, Node2, Node3, Level1, Level2, Level3;
    int nSize = Vec_WecSize(vProds);
    assert( nSize == Vec_WecSize(vLevels) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd  = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            vLevel = Vec_WecEntry( vLevels, i );

            Level1 = Vec_IntPop( vLevel );
            Level2 = Vec_IntPop( vLevel );
            Level3 = Vec_IntPop( vLevel );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            LevelS = Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 ) + 2;
            LevelC = LevelS - 1;

            Wlc_IntInsert( vProd, vLevel, NodeS, LevelS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            vLevel = Vec_WecEntry( vLevels, i+1 );

            Wlc_IntInsert( vProd, vLevel, NodeC, LevelC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }

    vLevel = Vec_WecEntry( vLevels, 0 );
    Vec_IntClear( vRes );
    Vec_IntClear( vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,   Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vLevel, Vec_IntEntry(vProd, 1) );
    }
    Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), nSize );
}